

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O0

void psh_glyph_interpolate_other_points(PSH_Glyph glyph,FT_Int dimension)

{
  uint uVar1;
  FT_Fixed FVar2;
  PSH_Point pPVar3;
  PSH_Point_conflict pPVar4;
  PSH_Point pPVar5;
  FT_Int32 FVar6;
  FT_Long FVar7;
  long lVar8;
  FT_Int32 b;
  FT_Int32 local_a8;
  FT_Fixed scale_ab;
  FT_Pos cur_c;
  FT_Pos org_ac;
  FT_Pos org_c;
  FT_Pos cur_ab;
  FT_Pos cur_a;
  FT_Pos org_ab;
  FT_Pos org_a;
  PSH_Point pPStack_60;
  FT_UInt fit_count;
  PSH_Point_conflict point;
  PSH_Point_conflict next;
  PSH_Point_conflict first;
  PSH_Point_conflict start;
  PSH_Contour pPStack_38;
  FT_UInt num_contours;
  PSH_Contour contour;
  FT_Fixed delta;
  FT_Fixed scale;
  PSH_Dimension dim;
  FT_Int dimension_local;
  PSH_Glyph glyph_local;
  
  FVar2 = glyph->globals->dimension[dimension].scale_mult;
  contour = (PSH_Contour)glyph->globals->dimension[dimension].scale_delta;
  pPStack_38 = glyph->contours;
  start._4_4_ = glyph->num_contours;
  do {
    if (start._4_4_ == 0) {
      return;
    }
    pPVar3 = pPStack_38->start;
    uVar1 = pPStack_38->count;
    org_a._4_4_ = 0;
    next = (PSH_Point_conflict)0x0;
    for (pPStack_60 = pPVar3; pPVar4 = next, pPStack_60 < pPVar3 + uVar1;
        pPStack_60 = pPStack_60 + 1) {
      if ((pPStack_60->flags2 & 0x20) != 0) {
        if (next == (PSH_Point_conflict)0x0) {
          next = pPStack_60;
        }
        org_a._4_4_ = org_a._4_4_ + 1;
      }
    }
    b = (FT_Int32)FVar2;
    pPVar5 = next;
    if (org_a._4_4_ < 2) {
      pPStack_60 = pPVar3;
      if (org_a._4_4_ == 1) {
        lVar8 = next->cur_u;
        FVar6 = FT_MulFix_x86_64((FT_Int32)next->org_u,b);
        contour = (PSH_Contour)(lVar8 - FVar6);
      }
      for (; pPStack_60 < pPVar3 + uVar1; pPStack_60 = pPStack_60 + 1) {
        if (pPStack_60 != next) {
          FVar6 = FT_MulFix_x86_64((FT_Int32)pPStack_60->org_u,b);
          pPStack_60->cur_u = (long)&contour->start + (long)FVar6;
        }
      }
    }
    else {
      do {
        do {
          next = pPVar5;
          point = next->next;
          if (point == pPVar4) goto LAB_00313876;
          pPVar5 = point;
        } while ((point->flags2 & 0x20) != 0);
        do {
          point = point->next;
        } while ((point->flags2 & 0x20) == 0);
        if (point->org_u < next->org_u) {
          org_ab = point->org_u;
          cur_ab = point->cur_u;
          cur_a = next->org_u - org_ab;
          org_c = next->cur_u - cur_ab;
        }
        else {
          org_ab = next->org_u;
          cur_ab = next->cur_u;
          cur_a = point->org_u - org_ab;
          org_c = point->cur_u - cur_ab;
        }
        local_a8 = 0x10000;
        if (0 < cur_a) {
          FVar7 = FT_DivFix(org_c,cur_a);
          local_a8 = (FT_Int32)FVar7;
        }
        pPStack_60 = next->next;
        do {
          lVar8 = pPStack_60->org_u - org_ab;
          FVar6 = (FT_Int32)lVar8;
          if (lVar8 < 1) {
            FVar6 = FT_MulFix_x86_64(FVar6,b);
            scale_ab = cur_ab + FVar6;
          }
          else if (lVar8 < cur_a) {
            FVar6 = FT_MulFix_x86_64(FVar6,local_a8);
            scale_ab = cur_ab + FVar6;
          }
          else {
            FVar6 = FT_MulFix_x86_64(FVar6 - (int)cur_a,b);
            scale_ab = cur_ab + org_c + (long)FVar6;
          }
          pPStack_60->cur_u = scale_ab;
          pPStack_60 = pPStack_60->next;
        } while (pPStack_60 != point);
        pPVar5 = point;
      } while (point != pPVar4);
    }
LAB_00313876:
    start._4_4_ = start._4_4_ - 1;
    pPStack_38 = pPStack_38 + 1;
  } while( true );
}

Assistant:

static void
  psh_glyph_interpolate_other_points( PSH_Glyph  glyph,
                                      FT_Int     dimension )
  {
    PSH_Dimension  dim          = &glyph->globals->dimension[dimension];
    FT_Fixed       scale        = dim->scale_mult;
    FT_Fixed       delta        = dim->scale_delta;
    PSH_Contour    contour      = glyph->contours;
    FT_UInt        num_contours = glyph->num_contours;


    for ( ; num_contours > 0; num_contours--, contour++ )
    {
      PSH_Point  start = contour->start;
      PSH_Point  first, next, point;
      FT_UInt    fit_count;


      /* count the number of strong points in this contour */
      next      = start + contour->count;
      fit_count = 0;
      first     = NULL;

      for ( point = start; point < next; point++ )
        if ( psh_point_is_fitted( point ) )
        {
          if ( !first )
            first = point;

          fit_count++;
        }

      /* if there are less than 2 fitted points in the contour, we */
      /* simply scale and eventually translate the contour points  */
      if ( fit_count < 2 )
      {
        if ( fit_count == 1 )
          delta = first->cur_u - FT_MulFix( first->org_u, scale );

        for ( point = start; point < next; point++ )
          if ( point != first )
            point->cur_u = FT_MulFix( point->org_u, scale ) + delta;

        goto Next_Contour;
      }

      /* there are more than 2 strong points in this contour; we */
      /* need to interpolate weak points between them            */
      start = first;
      do
      {
        /* skip consecutive fitted points */
        for (;;)
        {
          next = first->next;
          if ( next == start )
            goto Next_Contour;

          if ( !psh_point_is_fitted( next ) )
            break;

          first = next;
        }

        /* find next fitted point after unfitted one */
        for (;;)
        {
          next = next->next;
          if ( psh_point_is_fitted( next ) )
            break;
        }

        /* now interpolate between them */
        {
          FT_Pos    org_a, org_ab, cur_a, cur_ab;
          FT_Pos    org_c, org_ac, cur_c;
          FT_Fixed  scale_ab;


          if ( first->org_u <= next->org_u )
          {
            org_a  = first->org_u;
            cur_a  = first->cur_u;
            org_ab = next->org_u - org_a;
            cur_ab = next->cur_u - cur_a;
          }
          else
          {
            org_a  = next->org_u;
            cur_a  = next->cur_u;
            org_ab = first->org_u - org_a;
            cur_ab = first->cur_u - cur_a;
          }

          scale_ab = 0x10000L;
          if ( org_ab > 0 )
            scale_ab = FT_DivFix( cur_ab, org_ab );

          point = first->next;
          do
          {
            org_c  = point->org_u;
            org_ac = org_c - org_a;

            if ( org_ac <= 0 )
            {
              /* on the left of the interpolation zone */
              cur_c = cur_a + FT_MulFix( org_ac, scale );
            }
            else if ( org_ac >= org_ab )
            {
              /* on the right on the interpolation zone */
              cur_c = cur_a + cur_ab + FT_MulFix( org_ac - org_ab, scale );
            }
            else
            {
              /* within the interpolation zone */
              cur_c = cur_a + FT_MulFix( org_ac, scale_ab );
            }

            point->cur_u = cur_c;

            point = point->next;

          } while ( point != next );
        }

        /* keep going until all points in the contours have been processed */
        first = next;

      } while ( first != start );

    Next_Contour:
      ;
    }
  }